

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_output.hpp
# Opt level: O0

void write_output<std::vector<unsigned_long,std::allocator<unsigned_long>>>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *primes,endian output_endian,
               ostream *os)

{
  pointer puVar1;
  bool bVar2;
  size_type sVar3;
  reference puVar4;
  uchar *puVar5;
  unsigned_long v_2;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_2;
  unsigned_long v_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_1;
  unsigned_long v;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  uchar *ptr;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  ostream *os_local;
  endian output_endian_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *primes_local;
  
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)os;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(primes);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,sVar3 << 3);
  __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  if (output_endian == native) {
    __end0_2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(primes);
    v_2 = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(primes);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0_2,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&v_2), bVar2) {
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end0_2);
      __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 write<unsigned_long,(endian)0>(*puVar4,(uint8_t *)__range2);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end0_2);
    }
  }
  else if (output_endian == big) {
    __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(primes);
    v = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(primes);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&v), bVar2) {
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end0);
      __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 write<unsigned_long,(endian)1>(*puVar4,(uint8_t *)__range2);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end0);
    }
  }
  else if (output_endian == little) {
    __end0_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(primes);
    v_1 = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(primes);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&v_1), bVar2) {
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end0_1);
      __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 write<unsigned_long,(endian)2>(*puVar4,(uint8_t *)__range2);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end0_1);
    }
  }
  puVar1 = bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  std::ostream::write((char *)puVar1,(long)puVar5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void write_output (ContainerType const & primes, endian output_endian, std::ostream & os) {

    using int_type = typename ContainerType::value_type;
    std::vector<std::uint8_t> bytes;
    bytes.resize (primes.size () * sizeof (int_type));
    auto ptr = bytes.data ();
    switch (output_endian) {
    case endian::big:
        for (auto v : primes) {
            ptr = write<int_type, endian::big> (v, ptr);
        }
        break;
    case endian::little:
        for (auto v : primes) {
            ptr = write<int_type, endian::little> (v, ptr);
        }
        break;
    case endian::native:
        for (auto v : primes) {
            ptr = write<int_type, endian::native> (v, ptr);
        }
        break;
    }
    os.write (reinterpret_cast<std::ofstream::char_type const *> (bytes.data ()),
              static_cast<std::streamsize> (sizeof (std::uint8_t) * bytes.size ()));
}